

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

char * FIX::integer_to_string<unsigned_long>(char *buf,size_t len,unsigned_long t)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  
  pcVar3 = buf + len;
  for (; 99 < t; t = t / 100) {
    *(undefined2 *)(pcVar3 + -2) = *(undefined2 *)(digit_pairs + (t % 100) * 2);
    pcVar3 = pcVar3 + -2;
  }
  if (t < 10) {
    bVar1 = (byte)t | 0x30;
    lVar2 = -1;
  }
  else {
    bVar1 = digit_pairs[t * 2];
    pcVar3[-1] = digit_pairs[t * 2 + 1];
    lVar2 = -2;
  }
  pcVar3[lVar2] = bVar1;
  return pcVar3 + lVar2;
}

Assistant:

inline char *integer_to_string(char *buf, const size_t len, const T t) {
  const bool isNegative = t < 0;
  char *p = buf + len;

  typename std::make_unsigned<T>::type number = UNSIGNED_VALUE_OF(t);

  while (number > 99) {
    unsigned_int pos = number % 100;
    number /= 100;

    *--p = digit_pairs[2 * pos + 1];
    *--p = digit_pairs[2 * pos];
  }

  if (number > 9) {
    *--p = digit_pairs[2 * number + 1];
    *--p = digit_pairs[2 * number];
  } else {
    *--p = '0' + char(number);
  }

  if (isNegative) {
    *--p = '-';
  }

  return p;
}